

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VelocityZ.cpp
# Opt level: O0

void __thiscall OpenMD::VelocityZ::process(VelocityZ *this)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  SnapshotManager *this_00;
  Snapshot *pSVar6;
  reference pvVar7;
  double *pdVar8;
  ulong uVar9;
  reference pvVar10;
  size_type sVar11;
  reference this_01;
  reference pvVar12;
  long *in_RDI;
  double dVar13;
  undefined1 auVar14 [16];
  uint k;
  RealType totalVelocity;
  uint j_1;
  uint i_1;
  int binNo2;
  int binNo1;
  Vector3d pos_1;
  Vector3d pos;
  RealType halfBox2_;
  RealType halfBox1_;
  Mat3x3d hmat;
  uint j;
  uint i;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int ii;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffeba8;
  DumpReader *in_stack_ffffffffffffebb0;
  StuntDouble *in_stack_ffffffffffffebb8;
  SelectionManager *in_stack_ffffffffffffebc0;
  SelectionEvaluator *in_stack_ffffffffffffebe8;
  StuntDouble *in_stack_ffffffffffffec28;
  Snapshot *in_stack_ffffffffffffec30;
  Snapshot *in_stack_ffffffffffffec38;
  DumpReader *in_stack_ffffffffffffec40;
  Vector<double,_3U> local_1368;
  uint local_134c;
  DumpReader *local_1348;
  uint local_1340;
  uint local_133c;
  int local_1338;
  int local_1334;
  Vector<double,_3U> local_1330 [3];
  double local_12e8;
  double local_12e0;
  RectMatrix<double,_3U,_3U> local_12d8;
  uint local_1290;
  uint local_128c;
  int local_1288;
  int local_1274;
  string *in_stack_ffffffffffffee00;
  SimInfo *in_stack_ffffffffffffee08;
  DumpReader *in_stack_ffffffffffffee10;
  Snapshot *local_10;
  
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar4 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1f6880);
  DumpReader::DumpReader
            (in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee00);
  local_1274 = DumpReader::getNFrames(in_stack_ffffffffffffebb0);
  *(int *)(in_RDI + 0x1a) = local_1274 / (int)in_RDI[6];
  for (local_1288 = 0; local_1288 < local_1274; local_1288 = (int)in_RDI[6] + local_1288) {
    DumpReader::readFrame(in_stack_ffffffffffffec40,(int)((ulong)in_stack_ffffffffffffec38 >> 0x20))
    ;
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar6 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)pSVar6;
    for (local_128c = 0; local_128c < *(uint *)(in_RDI + 0xe2); local_128c = local_128c + 1) {
      for (local_1290 = 0; local_1290 < *(uint *)((long)in_RDI + 0x34); local_1290 = local_1290 + 1)
      {
        pvVar7 = std::
                 vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                               *)(in_RDI + 0xf3),(ulong)local_128c);
        std::
        vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
        ::operator[](pvVar7,(ulong)local_1290);
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::clear
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1f69ec
                  );
      }
    }
    Snapshot::getHmat(in_stack_ffffffffffffeba8);
    RectMatrix<double,_3U,_3U>::operator()
              (&local_12d8,*(uint *)((long)in_RDI + 0x75c),*(uint *)((long)in_RDI + 0x75c));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffebc0,
               (value_type_conflict2 *)in_stack_ffffffffffffebb8);
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       (&local_12d8,*(uint *)(in_RDI + 0xeb),*(uint *)(in_RDI + 0xeb));
    local_12e0 = *pdVar8 * 0.5;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       (&local_12d8,*(uint *)((long)in_RDI + 0x75c),*(uint *)((long)in_RDI + 0x75c))
    ;
    local_12e8 = *pdVar8 * 0.5;
    bVar5 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
    if (bVar5) {
      in_stack_ffffffffffffec40 = (DumpReader *)(in_RDI + 0xc9);
      SelectionEvaluator::evaluate(in_stack_ffffffffffffebe8);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffebc0,(SelectionSet *)in_stack_ffffffffffffebb8);
      SelectionSet::~SelectionSet((SelectionSet *)0x1f6bae);
    }
    in_stack_ffffffffffffec38 =
         (Snapshot *)
         SelectionManager::beginSelected(in_stack_ffffffffffffebc0,(int *)in_stack_ffffffffffffebb8)
    ;
    local_10 = in_stack_ffffffffffffec38;
    while (local_10 != (Snapshot *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffebb8);
      if (bVar4) {
        Snapshot::wrapVector(in_stack_ffffffffffffec30,(Vector3d *)in_stack_ffffffffffffec28);
      }
      StuntDouble::setPos((StuntDouble *)in_stack_ffffffffffffebc0,
                          (Vector3d *)in_stack_ffffffffffffebb8);
      in_stack_ffffffffffffec30 =
           (Snapshot *)
           SelectionManager::nextSelected
                     (in_stack_ffffffffffffebc0,(int *)in_stack_ffffffffffffebb8);
      local_10 = in_stack_ffffffffffffec30;
    }
    in_stack_ffffffffffffec28 =
         SelectionManager::beginSelected(in_stack_ffffffffffffebc0,(int *)in_stack_ffffffffffffebb8)
    ;
    local_10 = (Snapshot *)in_stack_ffffffffffffec28;
    while (local_10 != (Snapshot *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffebb8);
      dVar3 = local_12e0;
      uVar1 = *(uint *)((long)in_RDI + 0x34);
      pdVar8 = Vector<double,_3U>::operator[](local_1330,*(uint *)(in_RDI + 0xeb));
      dVar13 = *pdVar8;
      pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                         (&local_12d8,*(uint *)(in_RDI + 0xeb),*(uint *)(in_RDI + 0xeb));
      dVar2 = local_12e8;
      local_1334 = (int)(((double)uVar1 * (dVar3 + dVar13)) / *pdVar8);
      in_stack_ffffffffffffebe8 = (SelectionEvaluator *)(double)*(uint *)(in_RDI + 0xe2);
      pdVar8 = Vector<double,_3U>::operator[](local_1330,*(uint *)((long)in_RDI + 0x75c));
      dVar13 = (double)in_stack_ffffffffffffebe8 * (dVar2 + *pdVar8);
      pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                         (&local_12d8,*(uint *)((long)in_RDI + 0x75c),
                          *(uint *)((long)in_RDI + 0x75c));
      local_1338 = (int)(dVar13 / *pdVar8);
      pvVar7 = std::
               vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                             *)(in_RDI + 0xf3),(long)local_1338);
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[](pvVar7,(long)local_1334);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 in_stack_ffffffffffffebc0,(value_type *)in_stack_ffffffffffffebb8);
      local_10 = (Snapshot *)
                 SelectionManager::nextSelected
                           (in_stack_ffffffffffffebc0,(int *)in_stack_ffffffffffffebb8);
    }
    for (local_133c = 0; local_133c < *(uint *)(in_RDI + 0xe2); local_133c = local_133c + 1) {
      for (local_1340 = 0; local_1340 < *(uint *)((long)in_RDI + 0x34); local_1340 = local_1340 + 1)
      {
        local_1348 = (DumpReader *)0x0;
        local_134c = 0;
        while( true ) {
          uVar9 = (ulong)local_134c;
          pvVar7 = std::
                   vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                                 *)(in_RDI + 0xf3),(ulong)local_133c);
          pvVar10 = std::
                    vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    ::operator[](pvVar7,(ulong)local_1340);
          sVar11 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                             (pvVar10);
          if (sVar11 <= uVar9) break;
          pvVar7 = std::
                   vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                                 *)(in_RDI + 0xf3),(ulong)local_133c);
          pvVar10 = std::
                    vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    ::operator[](pvVar7,(ulong)local_1340);
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator[]
                    (pvVar10,(ulong)local_134c);
          StuntDouble::getVel(in_stack_ffffffffffffebb8);
          in_stack_ffffffffffffebc0 =
               (SelectionManager *)
               Vector<double,_3U>::operator[](&local_1368,*(uint *)(in_RDI + 0xec));
          local_1348 = (DumpReader *)
                       ((double)(((_Vector_base<double,_std::allocator<double>_> *)
                                 &in_stack_ffffffffffffebc0->info_)->_M_impl).
                                super__Vector_impl_data._M_start + (double)local_1348);
          local_134c = local_134c + 1;
        }
        pvVar7 = std::
                 vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                               *)(in_RDI + 0xf3),(ulong)local_133c);
        pvVar10 = std::
                  vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                  ::operator[](pvVar7,(ulong)local_1340);
        sVar11 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                           (pvVar10);
        if (sVar11 != 0) {
          in_stack_ffffffffffffebb0 = local_1348;
          pvVar7 = std::
                   vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                                 *)(in_RDI + 0xf3),(ulong)local_133c);
          pvVar10 = std::
                    vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    ::operator[](pvVar7,(ulong)local_1340);
          sVar11 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                             (pvVar10);
          auVar14._8_4_ = (int)(sVar11 >> 0x20);
          auVar14._0_8_ = sVar11;
          auVar14._12_4_ = 0x45300000;
          in_stack_ffffffffffffebb8 =
               (StuntDouble *)
               ((double)in_stack_ffffffffffffebb0 /
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)));
          this_01 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)(in_RDI + 0xf0),(ulong)local_133c);
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              (this_01,(ulong)local_1340);
          *pvVar12 = (double)in_stack_ffffffffffffebb8 + *pvVar12;
        }
      }
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f7171);
  }
  (**(code **)(*in_RDI + 0x20))();
  DumpReader::~DumpReader(in_stack_ffffffffffffebb0);
  return;
}

Assistant:

void VelocityZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          sliceSDLists_[i][j].clear();
        }
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();

      zBox_.push_back(hmat(axis2_, axis2_));

      RealType halfBox1_ = hmat(axis1_, axis1_) / 2.0;
      RealType halfBox2_ = hmat(axis2_, axis2_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo1 =
            int(nBins_ * (halfBox1_ + pos[axis1_]) / hmat(axis1_, axis1_));
        int binNo2 =
            int(nBins2_ * (halfBox2_ + pos[axis2_]) / hmat(axis2_, axis2_));
        sliceSDLists_[binNo2][binNo1].push_back(sd);
      }

      // loop over the slices to calculate the velocities
      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          RealType totalVelocity = 0;
          for (unsigned int k = 0; k < sliceSDLists_[i][j].size(); ++k) {
            totalVelocity += sliceSDLists_[i][j][k]->getVel()[axis3_];
          }

          if (sliceSDLists_[i][j].size() > 0)
            velocity_[i][j] += totalVelocity / sliceSDLists_[i][j].size();
        }
      }
    }

    writeVelocity();
  }